

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  bool bVar1;
  int iVar2;
  exr_context_t p_Var3;
  element_type *peVar4;
  char *pcVar5;
  ostream *poVar6;
  ArgExc *pAVar7;
  uint *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  uint *in_R8;
  undefined8 *in_R9;
  int *in_stack_00000008;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  lock_guard<std::mutex> lock;
  exr_chunk_info_t cinfo;
  mutex_type *__m;
  lock_guard<std::mutex> *in_stack_fffffffffffffa30;
  size_type in_stack_fffffffffffffa48;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  TiledInputFile *in_stack_fffffffffffffa58;
  stringstream local_520 [16];
  ostream local_510 [376];
  stringstream local_398 [16];
  ostream local_388 [376];
  stringstream local_210 [16];
  ostream local_200 [400];
  mutex_type local_70;
  undefined8 *local_30;
  uint *local_28;
  uint *local_20;
  int *local_18;
  uint *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  p_Var3 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x236344);
  peVar4 = std::
           __shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x23635d);
  __m = &local_70;
  iVar2 = exr_read_tile_chunk_info
                    (p_Var3,peVar4->partNumber,*local_10,*local_18,*local_20,*local_28);
  if (iVar2 != 0) {
    bVar1 = isValidTile(in_stack_fffffffffffffa58,(int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                        (int)in_stack_fffffffffffffa50,(int)(in_stack_fffffffffffffa48 >> 0x20),
                        (int)in_stack_fffffffffffffa48);
    if (!bVar1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_398);
      poVar6 = std::operator<<(local_388,"Error reading pixel data from image file \"");
      pcVar5 = fileName((TiledInputFile *)0x2366f5);
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6,"\". ");
      std::operator<<(poVar6,"Tried to read a tile outside the image file\'s data window.");
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar7,local_398);
      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_520);
    poVar6 = std::operator<<(local_510,"Error reading chunk information for tile from image file \""
                            );
    pcVar5 = fileName((TiledInputFile *)0x236800);
    poVar6 = std::operator<<(poVar6,pcVar5);
    std::operator<<(poVar6,"\". Unable to read raw tile offset information.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar7,local_520);
    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2363c8);
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffa30,__m);
  std::__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2363ec);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  *in_stack_00000008 = local_70.super___mutex_base._M_mutex._32_4_;
  p_Var3 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x236420);
  peVar4 = std::
           __shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x236441);
  iVar2 = peVar4->partNumber;
  std::__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x236458);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x236464);
  iVar2 = exr_read_chunk(p_Var3,iVar2,&local_70,pcVar5);
  if (iVar2 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_210);
    poVar6 = std::operator<<(local_200,"Error reading pixel data from image file \"");
    pcVar5 = fileName((TiledInputFile *)0x2364e0);
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::operator<<(poVar6,"\". Unable to read raw tile data of ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*in_stack_00000008);
    std::operator<<(poVar6," bytes.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar7,local_210);
    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2365f7);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x236603);
  *local_30 = pcVar5;
  *local_10 = local_70.super___mutex_base._M_mutex.__data.__count;
  *local_18 = local_70.super___mutex_base._M_mutex.__data.__owner;
  *local_20 = (uint)(byte)local_70.super___mutex_base._M_mutex.__size[0x14];
  *local_28 = (uint)(byte)local_70.super___mutex_base._M_mutex.__size[0x15];
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x236664);
  return;
}

Assistant:

void
TiledInputFile::rawTileData (
    int&         dx,
    int&         dy,
    int&         lx,
    int&         ly,
    const char*& pixelData,
    int&         pixelDataSize)
{
    exr_chunk_info_t cinfo;
    if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
            _ctxt, _data->partNumber, dx, dy, lx, ly, &cinfo))
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_data->_mx);
#endif
        _data->_tile_data_scratch.resize (cinfo.packed_size);
        pixelDataSize = static_cast<int> (cinfo.packed_size);
        if (EXR_ERR_SUCCESS !=
            exr_read_chunk (_ctxt, _data->partNumber, &cinfo,
                            _data->_tile_data_scratch.data ()))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName () << "\". Unable to read raw tile data of "
                    << pixelDataSize << " bytes.");
        }
        pixelData = _data->_tile_data_scratch.data ();
        dx = cinfo.start_x;
        dy = cinfo.start_y;
        lx = cinfo.level_x;
        ly = cinfo.level_y;
    }
    else
    {
        if (!isValidTile (dx, dy, lx, ly))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                << fileName () << "\". "
                << "Tried to read a tile outside "
                "the image file's data window.");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading chunk information for tile from image "
                "file \""
                << fileName () << "\". Unable to read raw tile offset information.");
        }
    }
}